

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConfig.cpp
# Opt level: O0

void __thiscall NaConfigPart::SetInstance(NaConfigPart *this,char *szInstance)

{
  size_t sVar1;
  void *pvVar2;
  char *in_RSI;
  long in_RDI;
  
  if (in_RSI == (char *)0x0) {
    if (*(void **)(in_RDI + 0x10) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x10));
    }
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  else {
    sVar1 = strlen(in_RSI);
    pvVar2 = operator_new__(sVar1 + 1);
    *(void **)(in_RDI + 0x10) = pvVar2;
    strcpy(*(char **)(in_RDI + 0x10),in_RSI);
  }
  return;
}

Assistant:

void
NaConfigPart::SetInstance (const char* szInstance)
{
    if(NULL == szInstance){
        delete[] szInstanceName;
        szInstanceName = NULL;
    }
    else{
        szInstanceName = new char[strlen(szInstance) + 1];
        strcpy(szInstanceName, szInstance);
    }
}